

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

SourceBuffer * __thiscall
slang::SourceManager::cacheBuffer
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,path *path,
          SourceLocation includedFrom,vector<char,_std::allocator<char>_> *buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var3;
  pointer pcVar4;
  pointer pcVar5;
  char *pcVar6;
  uint uVar7;
  long lVar8;
  path *__p;
  unique_lock<std::shared_mutex> *puVar9;
  pair<std::_Rb_tree_iterator<std::filesystem::__cxx11::path>,_bool> pVar10;
  pair<_3562ccc5_> pVar11;
  unique_lock<std::shared_mutex> lock;
  error_code ec;
  _Alloc_hider local_d8;
  char *local_d0;
  char local_c8;
  undefined7 uStack_c7;
  undefined8 local_c0;
  path local_b8;
  undefined1 local_90 [8];
  bool local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Head_base<0UL,_slang::SourceManager::FileData_*,_false> local_68 [2];
  long local_58;
  SourceLocation local_48;
  int local_40;
  undefined8 local_38;
  
  local_d8._M_p = &local_c8;
  local_d0 = (char *)0x0;
  local_c8 = '\0';
  puVar9 = (unique_lock<std::shared_mutex> *)buffer;
  local_48 = includedFrom;
  if (this->disableProximatePaths == false) {
    local_40 = 0;
    local_38 = std::_V2::system_category();
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::proximate((path *)local_90,path,(error_code *)&local_b8);
    std::filesystem::__cxx11::path::~path(&local_b8);
    local_68[0]._M_head_impl = (FileData *)&local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_90,(pointer)((long)local_90 + CONCAT71(uStack_87,local_88)))
    ;
    std::__cxx11::string::operator=((string *)&local_d8,(string *)local_68);
    if (local_68[0]._M_head_impl != (FileData *)&local_58) {
      operator_delete(local_68[0]._M_head_impl,local_58 + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)local_90);
    if (local_40 != 0) {
      puVar9 = (unique_lock<std::shared_mutex> *)0x0;
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0);
    }
    if (local_d0 != (char *)0x0) goto LAB_001af3ad;
  }
  sVar2 = (path->_M_pathname)._M_string_length;
  if (sVar2 == 0) {
LAB_001af34e:
    std::filesystem::__cxx11::path::path(&local_b8);
  }
  else {
    _Var3._M_head_impl =
         (path->_M_cmpts)._M_impl._M_t.
         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
         .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
    uVar7 = (uint)_Var3._M_head_impl;
    __p = path;
    if ((~(byte)_Var3._M_head_impl & 3) != 0) {
      if ((((ulong)_Var3._M_head_impl & 3) == 0) &&
         ((path->_M_pathname)._M_dataplus._M_p[sVar2 - 1] != '/')) {
        if (((ulong)_Var3._M_head_impl & 3) == 0) {
          lVar8 = std::filesystem::__cxx11::path::_List::end();
          __p = (path *)(lVar8 + -0x30);
          if (((ulong)(path->_M_cmpts)._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl & 3) != 0) {
            __p = path;
          }
          uVar7 = (uint)(__p->_M_cmpts)._M_impl._M_t.
                        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                        .
                        super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                        ._M_head_impl;
        }
        if ((~uVar7 & 3) == 0) goto LAB_001af342;
      }
      goto LAB_001af34e;
    }
LAB_001af342:
    std::filesystem::__cxx11::path::path(&local_b8,__p);
  }
  local_90 = (undefined1  [8])&local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,local_b8._M_pathname._M_dataplus._M_p,
             local_b8._M_pathname._M_dataplus._M_p + local_b8._M_pathname._M_string_length);
  std::__cxx11::string::operator=((string *)&local_d8,(string *)local_90);
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_b8);
LAB_001af3ad:
  local_88 = false;
  local_90 = (undefined1  [8])this;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)local_90);
  local_88 = true;
  std::filesystem::__cxx11::path::parent_path();
  pVar10 = std::
           _Rb_tree<std::filesystem::__cxx11::path,_std::filesystem::__cxx11::path,_std::_Identity<std::filesystem::__cxx11::path>,_std::less<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
           ::_M_insert_unique<std::filesystem::__cxx11::path>(&(this->directories)._M_t,&local_b8);
  local_68[0]._M_head_impl = (FileData *)operator_new(0x58);
  pcVar6 = local_d0;
  if (local_d8._M_p == &local_c8) {
    ((local_68[0]._M_head_impl)->name)._M_dataplus._M_p =
         (pointer)&((local_68[0]._M_head_impl)->name).field_2;
    ((local_68[0]._M_head_impl)->name).field_2._M_allocated_capacity = CONCAT71(uStack_c7,local_c8);
    *(undefined8 *)((long)&((local_68[0]._M_head_impl)->name).field_2 + 8) = local_c0;
  }
  else {
    ((local_68[0]._M_head_impl)->name)._M_dataplus._M_p = local_d8._M_p;
    ((local_68[0]._M_head_impl)->name).field_2._M_allocated_capacity = CONCAT71(uStack_c7,local_c8);
    local_d8._M_p = &local_c8;
  }
  local_c8 = '\0';
  local_d0 = (char *)0x0;
  ((local_68[0]._M_head_impl)->name)._M_string_length = (size_type)pcVar6;
  pcVar5 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  ((local_68[0]._M_head_impl)->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  ((local_68[0]._M_head_impl)->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = pcVar5;
  ((local_68[0]._M_head_impl)->mem).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_68[0]._M_head_impl)->lineOffsets).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_68[0]._M_head_impl)->lineOffsets).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_68[0]._M_head_impl)->lineOffsets).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_68[0]._M_head_impl)->directory = (path *)(pVar10.first._M_node._M_node + 1);
  std::filesystem::__cxx11::path::~path(&local_b8);
  paVar1 = &local_b8._M_pathname.field_2;
  pcVar4 = (path->_M_pathname)._M_dataplus._M_p;
  local_b8._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar4,pcVar4 + (path->_M_pathname)._M_string_length);
  pVar11 = ska::detailv3::
           sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
           ::
           emplace<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>
                     ((sherwood_v3_table<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::__cxx11::string,slang::Hasher<std::__cxx11::string>,ska::detailv3::KeyOrValueHasher<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,slang::Hasher<std::__cxx11::string>>,std::equal_to<std::__cxx11::string>,ska::detailv3::KeyOrValueEquality<std::__cxx11::string,std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>,std::equal_to<std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::__cxx11::string,std::unique_ptr<slang::SourceManager::FileData,std::default_delete<slang::SourceManager::FileData>>>>>>
                       *)&this->lookupCache,&local_b8._M_pathname,
                      (unique_ptr<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                       *)local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_pathname._M_dataplus._M_p,
                    local_b8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    createBufferEntry(__return_storage_ptr__,this,
                      ((pVar11.first.current.current)->field_1).value.second._M_t.
                      super___uniq_ptr_impl<slang::SourceManager::FileData,_std::default_delete<slang::SourceManager::FileData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_slang::SourceManager::FileData_*,_std::default_delete<slang::SourceManager::FileData>_>
                      .super__Head_base<0UL,_slang::SourceManager::FileData_*,_false>._M_head_impl,
                      local_48,puVar9);
    if (local_68[0]._M_head_impl != (FileData *)0x0) {
      std::default_delete<slang::SourceManager::FileData>::operator()
                ((default_delete<slang::SourceManager::FileData> *)local_68,local_68[0]._M_head_impl
                );
    }
    std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_90);
    if (local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,CONCAT71(uStack_c7,local_c8) + 1);
    }
    return __return_storage_ptr__;
  }
  assert::assertFailed
            ("inserted",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
             ,0x21b,
             "SourceBuffer slang::SourceManager::cacheBuffer(const fs::path &, SourceLocation, std::vector<char> &&)"
            );
}

Assistant:

SourceBuffer SourceManager::cacheBuffer(const fs::path& path, SourceLocation includedFrom,
                                        std::vector<char>&& buffer) {
    std::string name;
    if (!disableProximatePaths) {
        std::error_code ec;
        name = fs::proximate(path, ec).u8string();
        if (ec)
            name = {};
    }

    if (name.empty())
        name = path.filename().u8string();

    std::unique_lock lock(mut);

    auto fd = std::make_unique<FileData>(&*directories.insert(path.parent_path()).first,
                                         std::move(name), std::move(buffer));

    auto [it, inserted] = lookupCache.emplace(path.u8string(), std::move(fd));
    ASSERT(inserted);

    FileData* fdPtr = it->second.get();
    return createBufferEntry(fdPtr, includedFrom, lock);
}